

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_diag_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_table_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix,
          int s1_beg,int s1_end,int s2_beg,int s2_end)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 uVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  parasail_result_t *ppVar8;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int64_t *ptr_02;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int64_t iVar16;
  ulong uVar17;
  long lVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  int64_t *piVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  __m128i_64_t B_2;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  __m128i_64_t B_3;
  long lVar33;
  __m128i_64_t A_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar36;
  __m128i_64_t A;
  int64_t iVar37;
  long lVar38;
  long lVar39;
  long lVar41;
  long lVar42;
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  long lVar44;
  __m128i_64_t B_1;
  long lVar46;
  undefined1 auVar45 [16];
  __m128i_64_t B;
  long lVar48;
  undefined1 auVar47 [16];
  undefined1 local_1d8 [16];
  long lStack_1a0;
  long local_188;
  long local_180;
  long local_178;
  long lStack_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  long local_148;
  long lStack_140;
  undefined8 local_138;
  long lStack_130;
  char *local_128;
  long lStack_120;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  ulong local_d0;
  long local_c8;
  int *local_c0;
  int64_t *local_b8;
  long local_b0;
  long local_a8;
  ulong local_a0;
  ulong local_98;
  long local_90;
  int *local_88;
  int *local_80;
  undefined1 local_78 [16];
  long local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  
  if (_s2 == (char *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_7();
    return (parasail_result_t *)0x0;
  }
  if (s2Len < 1) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_6();
    return (parasail_result_t *)0x0;
  }
  if (open < 0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_5();
    return (parasail_result_t *)0x0;
  }
  if (gap < 0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_4();
    return (parasail_result_t *)0x0;
  }
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_sg_flags_table_diag_sse2_128_64_cold_3();
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    if (_s1 == (char *)0x0) {
      parasail_sg_flags_table_diag_sse2_128_64_cold_2();
      return (parasail_result_t *)0x0;
    }
    if (_s1Len < 1) {
      parasail_sg_flags_table_diag_sse2_128_64_cold_1();
      return (parasail_result_t *)0x0;
    }
  }
  else {
    _s1Len = matrix->length;
  }
  iVar13 = matrix->min;
  iVar19 = -open;
  local_d0 = 0x8000000000000000 - (long)iVar13;
  if (iVar13 != iVar19 && SBORROW4(iVar13,iVar19) == iVar13 + open < 0) {
    local_d0 = (ulong)(uint)open | 0x8000000000000000;
  }
  lVar11 = local_d0 + 1;
  lVar14 = 0x7ffffffffffffffe - (long)matrix->max;
  auVar25._8_4_ = (int)lVar11;
  auVar25._0_8_ = lVar11;
  auVar25._12_4_ = (int)((ulong)lVar11 >> 0x20);
  uVar9 = (ulong)_s1Len;
  local_a8 = uVar9 - 1;
  uVar24 = (ulong)(uint)s2Len;
  local_90 = uVar24 - 1;
  local_78 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  if (s1_beg == 0) {
    local_78._4_4_ = 0;
    local_78._0_4_ = gap * 2;
    local_78._8_4_ = gap * 2;
    local_78._12_4_ = 0;
  }
  lStack_1a0 = auVar25._8_8_;
  local_e8._8_8_ = lStack_1a0;
  local_e8._0_8_ = lVar11;
  local_f8._8_8_ = lStack_1a0;
  local_f8._0_8_ = lVar11;
  local_108._8_8_ = lStack_1a0;
  local_108._0_8_ = lVar11;
  local_158._8_8_ = lStack_1a0;
  local_158._0_8_ = lVar11;
  local_118._8_8_ = lStack_1a0;
  local_118._0_8_ = lVar11;
  if (s1_beg == 0) {
    local_168._8_8_ = (long)iVar19;
    local_168._0_8_ = (long)(iVar19 - gap);
  }
  local_128 = _s1;
  ppVar8 = parasail_result_new_table1(_s1Len,s2Len);
  if (ppVar8 == (parasail_result_t *)0x0) {
    return (parasail_result_t *)0x0;
  }
  local_138._4_4_ = 0;
  ppVar8->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar8->flag | 0x2821002;
  uVar10 = (ulong)(s2Len + 2);
  local_138._0_4_ = open;
  ptr = parasail_memalign_int64_t(0x10,uVar10);
  ptr_00 = parasail_memalign_int64_t(0x10,uVar10);
  ptr_01 = parasail_memalign_int64_t(0x10,uVar10);
  if (ptr_01 == (int64_t *)0x0 || (ptr_00 == (int64_t *)0x0 || ptr == (int64_t *)0x0)) {
    return (parasail_result_t *)0x0;
  }
  if (matrix->type == 0) {
    ptr_02 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
    if (ptr_02 == (int64_t *)0x0) {
      return (parasail_result_t *)0x0;
    }
    if (0 < _s1Len) {
      piVar1 = matrix->mapper;
      uVar10 = 0;
      do {
        ptr_02[uVar10] = (long)piVar1[(byte)local_128[uVar10]];
        uVar10 = uVar10 + 1;
      } while (uVar9 != uVar10);
    }
    ptr_02[uVar9] = 0;
  }
  else {
    ptr_02 = (int64_t *)0x0;
  }
  uVar4 = local_138._4_4_;
  iVar13 = (int)local_138;
  lVar20 = CONCAT44(local_138._4_4_,(int)local_138);
  local_148 = lVar14;
  lStack_140 = lVar14;
  local_48 = (int)local_138;
  uStack_44 = local_138._4_4_;
  iStack_40 = (int)local_138;
  uStack_3c = local_138._4_4_;
  local_58._0_8_ = CONCAT44(0,gap);
  local_58._8_4_ = gap;
  local_58._12_4_ = 0;
  auVar5 = local_58;
  piVar1 = matrix->mapper;
  uVar10 = 1;
  if (1 < s2Len) {
    uVar10 = (ulong)(uint)s2Len;
  }
  uVar15 = 0;
  do {
    ptr[uVar15 + 1] = (long)piVar1[(byte)_s2[uVar15]];
    uVar15 = uVar15 + 1;
  } while (uVar10 != uVar15);
  *ptr = 0;
  ptr[uVar24 + 1] = 0;
  local_b0 = (long)iVar19;
  if (s2_beg == 0) {
    uVar10 = 1;
    if (1 < s2Len) {
      uVar10 = (ulong)(uint)s2Len;
    }
    uVar15 = 0;
    lVar39 = local_b0;
    do {
      ptr_00[uVar15 + 1] = lVar39;
      ptr_01[uVar15 + 1] = lVar11;
      uVar15 = uVar15 + 1;
      lVar39 = lVar39 - (ulong)(uint)gap;
    } while (uVar10 != uVar15);
  }
  else {
    uVar15 = 0;
    do {
      ptr_00[uVar15 + 1] = 0;
      ptr_01[uVar15 + 1] = lVar11;
      uVar15 = uVar15 + 1;
    } while (uVar10 != uVar15);
  }
  *ptr_00 = lVar11;
  *ptr_01 = lVar11;
  ptr_00[uVar24 + 1] = lVar11;
  ptr_01[uVar24 + 1] = lVar11;
  *ptr_00 = 0;
  local_178 = lVar11;
  if (_s1Len < 1) {
    lStack_170 = lStack_1a0;
  }
  else {
    local_c0 = matrix->matrix;
    local_68 = lStack_1a0;
    uStack_60 = 0;
    local_98 = (ulong)(s2Len + 1);
    local_c8 = uVar24 * 8;
    local_180 = uVar24 * 4 + -4;
    local_1d8 = ZEXT416(1);
    local_188 = 0;
    local_a0 = 0;
    lStack_170 = lStack_1a0;
    local_b8 = ptr_02;
    piVar23 = ptr_02;
    do {
      uVar10 = local_a0;
      if (matrix->type == 0) {
        uVar10 = piVar23[local_a0];
      }
      uVar15 = local_a0 | 1;
      uVar6 = (uint)local_a0;
      if (matrix->type == 0) {
        iVar16 = piVar23[uVar15];
      }
      else {
        uVar12 = _s1Len - 1;
        if (uVar15 < uVar9) {
          uVar12 = uVar6 | 1;
        }
        iVar16 = (int64_t)(int)uVar12;
      }
      iVar7 = matrix->size;
      lVar20 = -(ulong)(local_1d8._0_8_ == local_a8);
      local_a0 = local_a0 + 2;
      iVar22 = iVar19 - uVar6 * gap;
      iVar37 = *ptr_00;
      *ptr_00 = local_b0 - local_a0 * (uint)gap;
      local_80 = local_c0 + uVar10 * (long)iVar7;
      local_88 = local_c0 + iVar16 * iVar7;
      local_128 = (char *)-(ulong)((long)local_1d8._0_8_ < (long)uVar9);
      lStack_120 = -(ulong)((long)local_1d8._8_8_ < (long)uVar9);
      local_138._0_4_ = (int)lVar20;
      local_138._4_4_ = (undefined4)((ulong)lVar20 >> 0x20);
      lStack_130 = -(ulong)(local_1d8._8_8_ == local_a8);
      if (s1_beg != 0) {
        iVar22 = 0;
      }
      auVar45._8_8_ = (long)iVar22;
      auVar45._0_8_ = lStack_1a0;
      uVar17 = 0;
      auVar43 = ZEXT816(0xffffffffffffffff);
      auVar40 = auVar25;
      auVar47 = auVar25;
      lVar39 = lStack_1a0;
      do {
        lVar36 = auVar45._8_8_;
        lVar18 = ptr_00[uVar17 + 1];
        lVar44 = CONCAT44(uVar4,iVar13);
        lVar46 = CONCAT44(uVar4,iVar13);
        lVar38 = lVar36 - lVar44;
        lVar41 = lVar18 - lVar46;
        local_58._12_4_ = 0;
        lVar33 = auVar40._8_8_ - local_58._0_8_;
        if (lVar33 < lVar38) {
          lVar33 = lVar38;
        }
        lVar38 = ptr_01[uVar17 + 1] - local_58._8_8_;
        if (ptr_01[uVar17 + 1] - local_58._8_8_ < lVar41) {
          lVar38 = lVar41;
        }
        lVar39 = (local_c0 + iVar16 * iVar7)[ptr[uVar17]] + lVar39;
        lVar42 = (local_c0 + uVar10 * (long)iVar7)[ptr[uVar17 + 1]] + iVar37;
        lVar44 = auVar45._0_8_ - lVar44;
        lVar46 = lVar36 - lVar46;
        lVar41 = auVar47._0_8_ - local_58._0_8_;
        lVar48 = auVar47._8_8_ - local_58._8_8_;
        if (lVar41 < lVar44) {
          lVar41 = lVar44;
        }
        if (lVar48 < lVar46) {
          lVar48 = lVar46;
        }
        if (lVar39 <= lVar41) {
          lVar39 = lVar41;
        }
        if (lVar42 <= lVar48) {
          lVar42 = lVar48;
        }
        if (lVar39 <= lVar33) {
          lVar39 = lVar33;
        }
        if (lVar42 <= lVar38) {
          lVar42 = lVar38;
        }
        auVar40._8_8_ = lVar42;
        auVar40._0_8_ = lVar39;
        lVar44 = auVar43._0_8_;
        lVar46 = auVar43._8_8_;
        auVar47._8_8_ = -(ulong)(lVar46 == -1);
        auVar47._0_8_ = -(ulong)(lVar44 == -1);
        auVar45 = auVar47 & local_168 | ~auVar47 & auVar40;
        lVar39 = auVar45._0_8_;
        lVar42 = auVar45._8_8_;
        if (1 < uVar17) {
          if (lVar39 <= local_148) {
            local_148 = lVar39;
          }
          if (lVar42 <= lStack_140) {
            lStack_140 = lVar42;
          }
          if (local_178 <= lVar39) {
            local_178 = lVar39;
          }
          lVar21 = lVar42;
          if (lVar42 < lStack_170) {
            lVar21 = lStack_170;
          }
          lStack_170 = lVar21;
        }
        piVar1 = ((ppVar8->field_4).rowcols)->score_row;
        if (uVar17 < uVar24) {
          *(int *)((long)piVar1 + uVar17 * 4 + local_188) = auVar45._8_4_;
        }
        auVar30._8_8_ = lVar38;
        auVar30._0_8_ = lVar33;
        auVar34._8_8_ = lVar48;
        auVar34._0_8_ = lVar41;
        auVar40 = ~auVar47 & auVar30 | auVar47 & auVar25;
        if (uVar17 != 0 && uVar15 < uVar9) {
          *(int *)((long)piVar1 + uVar17 * 4 + local_180) = auVar45._0_4_;
        }
        auVar47 = ~auVar47 & auVar34 | auVar47 & auVar25;
        auVar35._8_8_ = -(ulong)(lVar46 == local_90);
        auVar35._0_8_ = -(ulong)(lVar44 == local_90);
        auVar26._0_4_ = (int)(auVar43._4_4_ ^ 0xffffffff) >> 0x1f;
        auVar26._4_4_ = (int)(auVar43._4_4_ ^ 0xffffffff) >> 0x1f;
        auVar26._8_4_ = (int)(auVar43._12_4_ ^ 0xffffffff) >> 0x1f;
        auVar26._12_4_ = (int)(auVar43._12_4_ ^ 0xffffffff) >> 0x1f;
        auVar31._8_8_ = -(ulong)(lVar46 < (long)uVar24);
        auVar31._0_8_ = -(ulong)(lVar44 < (long)uVar24);
        auVar32._8_8_ = -(ulong)(local_e8._8_8_ < lVar42);
        auVar32._0_8_ = -(ulong)(local_e8._0_8_ < lVar39);
        auVar27._8_8_ = -(ulong)(local_f8._8_8_ < lVar42);
        auVar27._0_8_ = -(ulong)(local_f8._0_8_ < lVar39);
        auVar2._8_8_ = -(ulong)(local_1d8._8_8_ == local_a8);
        auVar2._0_8_ = lVar20;
        auVar32 = auVar31 & auVar26 & auVar2 & auVar32;
        auVar3._8_8_ = -(ulong)((long)local_1d8._8_8_ < (long)uVar9);
        auVar3._0_8_ = (char *)-(ulong)((long)local_1d8._0_8_ < (long)uVar9);
        auVar27 = auVar3 & auVar35 & auVar27;
        local_e8 = auVar32 & auVar45 | ~auVar32 & local_e8;
        local_f8 = auVar27 & auVar45 | ~auVar27 & local_f8;
        local_108 = ~(auVar35 & auVar2) & local_108 | auVar45 & auVar35 & auVar2;
        local_158 = auVar27 & local_1d8 | ~auVar27 & local_158;
        local_118 = auVar32 & auVar43 | ~auVar32 & local_118;
        ptr_00[uVar17] = lVar39;
        ptr_01[uVar17] = auVar40._0_8_;
        auVar43._0_8_ = lVar44 + 1;
        auVar43._8_8_ = lVar46 + 1;
        uVar17 = uVar17 + 1;
        lVar39 = lVar36;
        iVar37 = lVar18;
      } while (s2Len + 1 != uVar17);
      local_1d8._8_8_ = local_1d8._8_8_ + 2;
      local_1d8._0_8_ = local_1d8._0_8_ + 2;
      local_168._8_8_ = local_168._8_8_ - local_78._8_8_;
      local_168._0_8_ = local_168._0_8_ - local_78._0_8_;
      local_188 = local_188 + local_c8;
      local_180 = local_180 + local_c8;
      piVar23 = local_b8;
    } while (local_a0 < uVar9);
  }
  lVar44 = 0;
  iVar13 = 0;
  iVar19 = 0;
  lVar18 = lVar11;
  lVar39 = lVar11;
  do {
    lVar46 = *(long *)(local_f8 + lVar44 * 8);
    if ((lVar11 < lVar46) ||
       ((lVar46 == lVar11 && (*(long *)(local_158 + lVar44 * 8) < (long)iVar13)))) {
      iVar13 = *(int *)(local_158 + lVar44 * 8);
      lVar11 = lVar46;
    }
    if (lVar18 < *(long *)(local_e8 + lVar44 * 8)) {
      iVar19 = *(int *)(local_118 + lVar44 * 8);
      lVar18 = *(long *)(local_e8 + lVar44 * 8);
    }
    if (lVar39 < *(long *)(local_108 + lVar44 * 8)) {
      lVar39 = *(long *)(local_108 + lVar44 * 8);
    }
    lVar44 = lVar44 + 1;
  } while ((int)lVar44 == 1);
  if (s1_end == 0 || s2_end == 0) {
    if (s1_end == 0) {
      iVar13 = _s1Len + -1;
      iVar7 = s2Len + -1;
      if (s2_end != 0) {
        lVar39 = lVar18;
        iVar7 = iVar19;
      }
      goto LAB_005a9111;
    }
  }
  else if ((lVar11 <= lVar18) && ((lVar11 != lVar18 || (iVar19 != s2Len + -1)))) {
    iVar13 = _s1Len + -1;
    lVar39 = lVar18;
    iVar7 = iVar19;
    goto LAB_005a9111;
  }
  lVar39 = lVar11;
  iVar7 = s2Len + -1;
LAB_005a9111:
  iVar19 = (int)lVar39;
  auVar28._8_8_ = -(ulong)(lStack_140 <= (long)local_d0);
  auVar28._0_8_ = -(ulong)(local_148 <= (long)local_d0);
  auVar29._8_8_ = -(ulong)(lVar14 < lStack_170);
  auVar29._0_8_ = -(ulong)(lVar14 < local_178);
  auVar29 = auVar29 | auVar28;
  if ((((((((((((((((auVar29 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar29 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar29 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar29 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar29 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar29 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar29 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar29 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar29 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar29 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar29 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar29 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0') {
    *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
    iVar19 = 0;
    iVar7 = 0;
    iVar13 = 0;
  }
  ppVar8->score = iVar19;
  ppVar8->end_query = iVar13;
  ppVar8->end_ref = iVar7;
  local_58 = auVar5;
  local_138 = lVar20;
  parasail_free(ptr_01);
  parasail_free(ptr_00);
  parasail_free(ptr);
  if (matrix->type == 0) {
    parasail_free(ptr_02);
    return ppVar8;
  }
  return ppVar8;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vOpen;
    __m128i vGap;
    __m128i vOne;
    __m128i vN;
    __m128i vGapN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxHRow;
    __m128i vMaxHCol;
    __m128i vLastVal;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vILimit1;
    __m128i vJLimit;
    __m128i vJLimit1;
    __m128i vIBoundary;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vGapN = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set1_epi64x_rpl(gap*N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxHRow = vNegInf;
    vMaxHCol = vNegInf;
    vLastVal = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vILimit1 = _mm_sub_epi64(vILimit, vOne);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);
    vJLimit1 = _mm_sub_epi64(vJLimit, vOne);
    vIBoundary = s1_beg ? _mm_set1_epi64x_rpl(0) : _mm_set_epi64x_rpl(
            -open-0*gap,
            -open-1*gap);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    if (s2_beg) {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = 0;
            F_pr[j] = NEG_LIMIT;
        }
    }
    else {
        for (j=0; j<s2Len; ++j) {
            H_pr[j] = -open - j*gap;
            F_pr[j] = NEG_LIMIT;
        }
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    H_pr[-1] = 0; /* upper left corner */

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf;
        __m128i vWH = vNegInf;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        __m128i vIeqLimit1 = _mm_cmpeq_epi64_rpl(vI, vILimit1);
        vNH = _mm_srli_si128(vNH, 8);
        vNH = _mm_insert_epi64_rpl(vNH, H_pr[-1], 1);
        vWH = _mm_srli_si128(vWH, 8);
        vWH = _mm_insert_epi64_rpl(vWH, s1_beg ? 0 : (-open - i*gap), 1);
        H_pr[-1] = -open - (i+N)*gap;
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_blendv_epi8_rpl(vWH, vIBoundary, cond);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across the i or j limit
             * boundary, extract the last value of the column or row */
            {
                __m128i vJeqLimit1 = _mm_cmpeq_epi64_rpl(vJ, vJLimit1);
                __m128i vJgtNegOne = _mm_cmpgt_epi64_rpl(vJ, vNegOne);
                __m128i vJltLimit = _mm_cmplt_epi64_rpl(vJ, vJLimit);
                __m128i cond_j = _mm_and_si128(vIltLimit, vJeqLimit1);
                __m128i cond_i = _mm_and_si128(vIeqLimit1,
                        _mm_and_si128(vJgtNegOne, vJltLimit));
                __m128i cond_max_row = _mm_cmpgt_epi64_rpl(vWH, vMaxHRow);
                __m128i cond_max_col = _mm_cmpgt_epi64_rpl(vWH, vMaxHCol);
                __m128i cond_last_val = _mm_and_si128(vIeqLimit1, vJeqLimit1);
                __m128i cond_all_row = _mm_and_si128(cond_max_row, cond_i);
                __m128i cond_all_col = _mm_and_si128(cond_max_col, cond_j);
                vMaxHRow = _mm_blendv_epi8_rpl(vMaxHRow, vWH, cond_all_row);
                vMaxHCol = _mm_blendv_epi8_rpl(vMaxHCol, vWH, cond_all_col);
                vLastVal = _mm_blendv_epi8_rpl(vLastVal, vWH, cond_last_val);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all_col);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all_row);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
        vIBoundary = _mm_sub_epi64(vIBoundary, vGapN);
    }

    /* alignment ending position */
    {
        int64_t max_row = NEG_LIMIT;
        int64_t max_col = NEG_LIMIT;
        int64_t last_val = NEG_LIMIT;
        int64_t *s = (int64_t*)&vMaxHRow;
        int64_t *t = (int64_t*)&vMaxHCol;
        int64_t *u = (int64_t*)&vLastVal;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++s, ++t, ++u, ++i, ++j) {
            if (*t > max_col || (*t == max_col && *i < end_query)) {
                max_col = *t;
                end_query = *i;
            }
            if (*s > max_row) {
                max_row = *s;
                end_ref = *j;
            }
            if (*u > last_val) {
                last_val = *u;
            }
        }
        if (s1_end && s2_end) {
            if (max_col > max_row || (max_col == max_row && end_ref == s2Len-1)) {
                score = max_col;
                end_ref = s2Len-1;
            }
            else {
                score = max_row;
                end_query = s1Len-1;
            }
        }
        else if (s1_end) {
            score = max_col;
            end_ref = s2Len-1;
        }
        else if (s2_end) {
            score = max_row;
            end_query = s1Len-1;
        }
        else {
            score = last_val;
            end_query = s1Len-1;
            end_ref = s2Len-1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}